

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessible.cpp
# Opt level: O0

QString * __thiscall
QAccessibleTextInterface::textBeforeOffset
          (QAccessibleTextInterface *this,int offset,TextBoundaryType boundaryType,int *startOffset,
          int *endOffset)

{
  bool bVar1;
  undefined4 uVar2;
  Int IVar3;
  int iVar4;
  qsizetype qVar5;
  QFlags<QTextBoundaryFinder::BoundaryReason> *this_00;
  long lVar6;
  undefined4 in_ECX;
  int in_EDX;
  long *in_RSI;
  QString *in_RDI;
  QString *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  BoundaryType type;
  QTextBoundaryFinder boundary;
  QString txt;
  QString *pQVar7;
  BoundaryType BVar8;
  uint in_stack_ffffffffffffff5c;
  QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4> local_74;
  undefined4 local_70;
  QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4> local_6c;
  undefined1 local_68 [4];
  int in_stack_ffffffffffffff9c;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = in_RDI;
  uVar2 = (**(code **)(*in_RSI + 0x68))();
  (**(code **)(*in_RSI + 0x48))(&local_20,in_RSI,0,uVar2);
  if (in_EDX == -1) {
    qVar5 = QString::size(&local_20);
    in_EDX = (int)qVar5;
  }
  *in_R9 = -1;
  *(undefined4 *)&(in_R8->d).d = 0xffffffff;
  bVar1 = QString::isEmpty((QString *)0x959344);
  if ((bVar1) || (in_EDX < 1)) {
LAB_00959373:
    QString::QString((QString *)0x95937d);
    goto LAB_00959566;
  }
  this_00 = (QFlags<QTextBoundaryFinder::BoundaryReason> *)(long)in_EDX;
  qVar5 = QString::size(&local_20);
  if (qVar5 < (long)this_00) goto LAB_00959373;
  BVar8 = Grapheme;
  switch(in_ECX) {
  case 0:
    BVar8 = Grapheme;
    break;
  case 1:
    BVar8 = Word;
    break;
  case 2:
    BVar8 = Sentence;
    break;
  case 3:
  case 4:
    textLineBoundary(in_EDX,in_R8,in_stack_ffffffffffffff9c,in_R9,
                     (int *)((ulong)in_stack_ffffffffffffff5c << 0x20));
    goto LAB_00959566;
  case 5:
    QString::QString((QString *)0x95940f);
    goto LAB_00959566;
  }
  memset(local_68,0xaa,0x48);
  QTextBoundaryFinder::QTextBoundaryFinder
            ((QTextBoundaryFinder *)local_68,BVar8,(QString *)&local_20);
  QTextBoundaryFinder::setPosition((longlong)local_68);
  do {
    local_70 = QTextBoundaryFinder::boundaryReasons();
    ::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
    local_6c.super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i =
         (QFlagsStorage<QTextBoundaryFinder::BoundaryReason>)
         QFlags<QTextBoundaryFinder::BoundaryReason>::operator&
                   (this_00,(QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
                            SUB84(pQVar7,0));
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_6c);
    if (IVar3 != 0) break;
    lVar6 = QTextBoundaryFinder::toPreviousBoundary();
  } while (0 < lVar6);
  iVar4 = QTextBoundaryFinder::position();
  *in_R9 = iVar4;
  do {
    lVar6 = QTextBoundaryFinder::toPreviousBoundary();
    if (lVar6 < 1) break;
    QTextBoundaryFinder::boundaryReasons();
    ::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
    local_74.super_QFlagsStorage<QTextBoundaryFinder::BoundaryReason>.i =
         (QFlagsStorage<QTextBoundaryFinder::BoundaryReason>)
         QFlags<QTextBoundaryFinder::BoundaryReason>::operator&
                   (this_00,(QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
                            SUB84(pQVar7,0));
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_74);
  } while (IVar3 == 0);
  uVar2 = QTextBoundaryFinder::position();
  *(undefined4 *)&(in_R8->d).d = uVar2;
  QString::mid((longlong)pQVar7,(longlong)&local_20);
  QTextBoundaryFinder::~QTextBoundaryFinder((QTextBoundaryFinder *)local_68);
LAB_00959566:
  QString::~QString((QString *)0x959573);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QAccessibleTextInterface::textBeforeOffset(int offset, QAccessible::TextBoundaryType boundaryType,
                                                   int *startOffset, int *endOffset) const
{
    const QString txt = text(0, characterCount());

    if (offset == -1)
        offset = txt.size();

    *startOffset = *endOffset = -1;
    if (txt.isEmpty() || offset <= 0 || offset > txt.size())
        return QString();

    // type initialized just to silence a compiler warning [-Werror=maybe-uninitialized]
    QTextBoundaryFinder::BoundaryType type = QTextBoundaryFinder::Grapheme;
    switch (boundaryType) {
    case QAccessible::CharBoundary:
        type = QTextBoundaryFinder::Grapheme;
        break;
    case QAccessible::WordBoundary:
        type = QTextBoundaryFinder::Word;
        break;
    case QAccessible::SentenceBoundary:
        type = QTextBoundaryFinder::Sentence;
        break;
    case QAccessible::LineBoundary:
    case QAccessible::ParagraphBoundary:
        // Lines can not use QTextBoundaryFinder since Line there means any potential line-break.
        return textLineBoundary(-1, txt, offset, startOffset, endOffset);
    case QAccessible::NoBoundary:
        // return empty, this function currently only supports single lines, so there can be no line before
        return QString();
    default:
        Q_UNREACHABLE();
    }

    // keep behavior in sync with QTextCursor::movePosition()!

    QTextBoundaryFinder boundary(type, txt);
    boundary.setPosition(offset);

    do {
        if ((boundary.boundaryReasons() & (QTextBoundaryFinder::StartOfItem | QTextBoundaryFinder::EndOfItem)))
            break;
    } while (boundary.toPreviousBoundary() > 0);
    Q_ASSERT(boundary.position() >= 0);
    *endOffset = boundary.position();

    while (boundary.toPreviousBoundary() > 0) {
        if ((boundary.boundaryReasons() & (QTextBoundaryFinder::StartOfItem | QTextBoundaryFinder::EndOfItem)))
            break;
    }
    Q_ASSERT(boundary.position() >= 0);
    *startOffset = boundary.position();

    return txt.mid(*startOffset, *endOffset - *startOffset);
}